

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O3

ASTNode * __thiscall
nivalis::anon_unknown_3::Differentiator::copy_ast
          (Differentiator *this,ASTNode *ast,
          vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *out)

{
  pointer *ppAVar1;
  iterator __position;
  anon_union_8_3_343d95dd_for_ASTNode_1 aVar2;
  undefined4 uVar3;
  ASTNode *pAVar4;
  ASTNode *n;
  ASTNode *local_28;
  
  local_28 = ast;
  skip_ast(&local_28);
  pAVar4 = local_28;
  if (local_28 != ast) {
    do {
      if (ast->opcode == 3) {
        copy_ast(this,(this->argv).
                      super__Vector_base<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].
                      super__Vector_base<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(ast->field_1).ref].
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,out);
      }
      else {
        __position._M_current =
             (out->
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (out->
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>::
          _M_realloc_insert<nivalis::Expr::ASTNode_const&>
                    ((vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>> *)out,
                     __position,ast);
        }
        else {
          uVar3 = *(undefined4 *)&ast->field_0x4;
          aVar2 = ast->field_1;
          (__position._M_current)->opcode = ast->opcode;
          *(undefined4 *)&(__position._M_current)->field_0x4 = uVar3;
          (__position._M_current)->field_1 = aVar2;
          ppAVar1 = &(out->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
      }
      ast = ast + 1;
    } while (ast != pAVar4);
  }
  return pAVar4;
}

Assistant:

const Expr::ASTNode* copy_ast(const Expr::ASTNode* ast,
            std::vector<Expr::ASTNode>& out) {
        const auto* init_pos = ast;
        skip_ast(&ast);
        for (const auto* n = init_pos; n != ast; ++n) {
            if (n->opcode == OpCode::arg) {
                // Substitute function argument in terms of the input
                copy_ast(&argv.back()[n->ref][0], out);
            } else {
                out.push_back(*n);
            }
        }
        return ast;
    }